

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

void __thiscall dg::llvmdg::LazyLLVMCallGraph::_initializeAddressTaken(LazyLLVMCallGraph *this)

{
  bool bVar1;
  reference this_00;
  ulong uVar2;
  Module *in_RDI;
  Function *in_stack_00000008;
  Function *F;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  reference in_stack_ffffffffffffffd0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  undefined8 local_10;
  
  in_RDI[0xa0] = (Module)0x1;
  local_10 = *(undefined8 *)(in_RDI + 0x40);
  local_18.NodePtr = (node_pointer)llvm::Module::begin(in_RDI);
  local_20.NodePtr = (node_pointer)llvm::Module::end(in_RDI);
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
              ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                           *)0x1895ef);
    uVar2 = llvm::GlobalValue::isDeclaration();
    if (((uVar2 & 1) == 0) && (bVar1 = funHasAddressTaken(in_stack_00000008), bVar1)) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)this_00,
                 (value_type *)in_RDI);
      in_stack_ffffffffffffffd0 = this_00;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void _initializeAddressTaken() {
        assert(!_address_taken_initialized);
        _address_taken_initialized = true;

        for (auto &F : *_module) {
            if (F.isDeclaration())
                continue;
            if (funHasAddressTaken(&F)) {
                _address_taken.push_back(&F);
            }
        }
    }